

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_brts_no_zeroinit.h
# Opt level: O3

void __thiscall BRTS_XZ<UF>::SecondScan(BRTS_XZ<UF> *this)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  Mat1b *pMVar4;
  Mat1i *pMVar5;
  long lVar6;
  long lVar7;
  uint *puVar8;
  Run *pRVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  uint uVar18;
  Run *pRVar19;
  int iVar21;
  undefined1 auVar20 [16];
  undefined1 auVar22 [16];
  int iVar24;
  undefined1 auVar23 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  long local_58;
  
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  lVar11 = (long)*(int *)&pMVar4->field_0x8;
  if (0 < lVar11) {
    iVar2 = *(int *)&pMVar4->field_0xc;
    pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    pRVar19 = (this->data_runs).runs;
    lVar6 = *(long *)&pMVar5->field_0x10;
    lVar7 = **(long **)&pMVar5->field_0x48;
    local_58 = lVar6 + 8;
    lVar10 = 0;
    auVar25 = _DAT_00328420;
    auVar26 = _DAT_00328430;
    auVar27 = _DAT_00328440;
    do {
      puVar8 = UF::P_;
      lVar17 = lVar7 * lVar10 + lVar6;
      uVar16 = 0;
      pRVar9 = pRVar19;
      do {
        pRVar19 = pRVar9;
        if (pRVar19->start_pos == 0xffff) {
          if ((int)uVar16 < iVar2) {
            memset((void *)(lVar17 + (long)(int)uVar16 * 4),0,(ulong)(~uVar16 + iVar2) * 4 + 4);
            auVar25 = _DAT_00328420;
            auVar26 = _DAT_00328430;
            auVar27 = _DAT_00328440;
          }
          pRVar19 = pRVar19 + 1;
          break;
        }
        uVar1 = pRVar19->end_pos;
        uVar3 = puVar8[pRVar19->label];
        uVar18 = (uint)pRVar19->start_pos;
        if (uVar16 < uVar18) {
          memset((void *)(lVar17 + (long)(int)uVar16 * 4),0,(ulong)(~uVar16 + uVar18) * 4 + 4);
          auVar25 = _DAT_00328420;
          auVar26 = _DAT_00328430;
          auVar27 = _DAT_00328440;
          uVar16 = uVar18;
        }
        if (uVar16 < uVar1) {
          lVar12 = (long)(int)uVar16;
          uVar16 = (uint)uVar1;
          lVar13 = (ulong)uVar1 - lVar12;
          lVar14 = lVar13 + -1;
          auVar20._8_4_ = (int)lVar14;
          auVar20._0_8_ = lVar14;
          auVar20._12_4_ = (int)((ulong)lVar14 >> 0x20);
          lVar12 = local_58 + lVar12 * 4;
          auVar20 = auVar20 ^ auVar27;
          uVar15 = 0;
          do {
            auVar22._8_4_ = (int)uVar15;
            auVar22._0_8_ = uVar15;
            auVar22._12_4_ = (int)(uVar15 >> 0x20);
            auVar23 = (auVar22 | auVar26) ^ auVar27;
            iVar21 = auVar20._4_4_;
            if ((bool)(~(iVar21 < auVar23._4_4_ ||
                        auVar20._0_4_ < auVar23._0_4_ && auVar23._4_4_ == iVar21) & 1)) {
              *(uint *)(lVar12 + -8 + uVar15 * 4) = uVar3;
            }
            if (auVar23._12_4_ <= auVar20._12_4_ &&
                (auVar23._8_4_ <= auVar20._8_4_ || auVar23._12_4_ != auVar20._12_4_)) {
              *(uint *)(lVar12 + -4 + uVar15 * 4) = uVar3;
            }
            auVar22 = (auVar22 | auVar25) ^ auVar27;
            iVar24 = auVar22._4_4_;
            if (iVar24 <= iVar21 && (iVar24 != iVar21 || auVar22._0_4_ <= auVar20._0_4_)) {
              *(uint *)(lVar12 + uVar15 * 4) = uVar3;
              *(uint *)(lVar12 + 4 + uVar15 * 4) = uVar3;
            }
            uVar15 = uVar15 + 4;
          } while ((lVar13 + 3U & 0xfffffffffffffffc) != uVar15);
        }
        pRVar9 = pRVar19 + 1;
      } while (uVar18 != 0xffff);
      lVar10 = lVar10 + 1;
      local_58 = local_58 + lVar7;
    } while (lVar10 != lVar11);
  }
  return;
}

Assistant:

void SecondScan() {
        int w(img_.cols);
        int h(img_.rows);

        Run* runs = data_runs.runs;
        for (int i = 0; i < h; i++) {
            unsigned* const labels = img_labels_.ptr<unsigned>(i);
            for (int j = 0;; runs++) {
                unsigned short start_pos = runs->start_pos;
                if (start_pos == 0xFFFF) {
                    for (; j < w; j++) labels[j] = 0;
                    runs++;
                    break;
                }
                unsigned short end_pos = runs->end_pos;
                int label = LabelsSolver::GetLabel(runs->label);
                for (; j < start_pos; j++) labels[j] = 0;
                for (; j < end_pos; j++) labels[j] = label;
            }
        }
    }